

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O1

size_t writeFunction(void *ptr,size_t size,size_t nmemb,Data *data)

{
  mapped_type *this;
  
  g_totalBytesDownloaded = g_totalBytesDownloaded + nmemb * size;
  std::__cxx11::string::append((char *)&data->content,(ulong)ptr);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](&g_fetchCache_abi_cxx11_,&data->uri);
  std::__cxx11::string::operator=((string *)this,(string *)&data->content);
  (data->content)._M_string_length = 0;
  *(data->content)._M_dataplus._M_p = '\0';
  return nmemb * size;
}

Assistant:

static size_t writeFunction(void *ptr, size_t size, size_t nmemb, Data* data) {
    size_t bytesDownloaded = size*nmemb;
    g_totalBytesDownloaded += bytesDownloaded;

    data->content.append((char*) ptr, bytesDownloaded);

#ifdef ENABLE_API_CACHE
    auto fname = ::getCacheFname(data->uri);

    std::ofstream fout(fname);
    fout.write(data->content.c_str(), data->content.size());
    fout.close();
#endif

    g_fetchCache[data->uri] = std::move(data->content);
    data->content.clear();

    return bytesDownloaded;
}